

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::register_logger(shared_ptr<spdlog::logger> *logger)

{
  shared_ptr<spdlog::logger> *in_RDI;
  registry *unaff_retaddr;
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffffb8;
  shared_ptr<spdlog::logger> *new_logger;
  
  new_logger = in_RDI;
  details::registry::instance();
  std::shared_ptr<spdlog::logger>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  details::registry::register_logger(unaff_retaddr,new_logger);
  CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x5d7c37);
  return;
}

Assistant:

SPDLOG_INLINE void register_logger(std::shared_ptr<logger> logger) {
    details::registry::instance().register_logger(std::move(logger));
}